

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool ON_BinaryArchive::ToggleByteOrder(size_t count,size_t sizeof_element,void *src,void *dst)

{
  ushort *puVar1;
  ushort *puVar2;
  ulong uVar3;
  undefined4 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  long lVar25;
  size_t sVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auStack_29 [41];
  
  if (count == 0) {
    return true;
  }
  if (dst != (void *)0x0 && (src != (void *)0x0 && sizeof_element != 0)) {
    lVar25 = count * sizeof_element;
    puVar1 = (ushort *)((long)dst + lVar25);
    if (sizeof_element == 2) {
      if (0 < lVar25) {
        lVar25 = 0;
        do {
          puVar2 = (ushort *)((long)dst + lVar25);
          *puVar2 = *(ushort *)((long)src + lVar25) << 8 | *(ushort *)((long)src + lVar25) >> 8;
          lVar25 = lVar25 + 2;
        } while (puVar2 + 1 < puVar1);
      }
    }
    else if (sizeof_element == 4) {
      if (0 < lVar25) {
        do {
          uVar4 = *src;
          src = (void *)((long)src + 4);
          auVar28._8_8_ = 0;
          auVar28._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)
                                                  ((uint)uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                               CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4)) >>
                                     0x10),(short)uVar4) & 0xffff00ff00ff00ff;
          auVar28 = pshuflw(auVar28,auVar28,0x1b);
          sVar5 = auVar28._0_2_;
          sVar6 = auVar28._2_2_;
          sVar7 = auVar28._4_2_;
          sVar8 = auVar28._6_2_;
          *(uint *)dst = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar28[6] - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar28[4] -
                                           (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar28[2] -
                                                    (0xff < sVar6),
                                                    (0 < sVar5) * (sVar5 < 0x100) * auVar28[0] -
                                                    (0xff < sVar5))));
          dst = (void *)((long)dst + 4);
        } while (dst < puVar1);
      }
    }
    else if (sizeof_element == 8) {
      if (0 < lVar25) {
        do {
          uVar3 = *src;
          src = (void *)((long)src + 8);
          auVar13._8_6_ = 0;
          auVar13._0_8_ = uVar3;
          auVar13[0xe] = (char)(uVar3 >> 0x38);
          auVar14._8_4_ = 0;
          auVar14._0_8_ = uVar3;
          auVar14[0xc] = (char)(uVar3 >> 0x30);
          auVar14._13_2_ = auVar13._13_2_;
          auVar15._8_4_ = 0;
          auVar15._0_8_ = uVar3;
          auVar15._12_3_ = auVar14._12_3_;
          auVar16._8_2_ = 0;
          auVar16._0_8_ = uVar3;
          auVar16[10] = (char)(uVar3 >> 0x28);
          auVar16._11_4_ = auVar15._11_4_;
          auVar17._8_2_ = 0;
          auVar17._0_8_ = uVar3;
          auVar17._10_5_ = auVar16._10_5_;
          auVar18[8] = (char)(uVar3 >> 0x20);
          auVar18._0_8_ = uVar3;
          auVar18._9_6_ = auVar17._9_6_;
          auVar27[7] = 0;
          auVar27._0_7_ = auVar18._8_7_;
          auVar21._7_8_ = 0;
          auVar21._0_7_ = auVar18._8_7_;
          auVar23._1_8_ = SUB158(auVar21 << 0x40,7);
          auVar23[0] = (char)(uVar3 >> 0x18);
          auVar23._9_6_ = 0;
          auVar22._1_10_ = SUB1510(auVar23 << 0x30,5);
          auVar22[0] = (char)(uVar3 >> 0x10);
          auVar24._11_4_ = 0;
          auVar24._0_11_ = auVar22;
          auVar19[2] = (char)(uVar3 >> 8);
          auVar19._0_2_ = (ushort)uVar3;
          auVar19._3_12_ = SUB1512(auVar24 << 0x20,3);
          auVar20._2_13_ = auVar19._2_13_;
          auVar20._0_2_ = (ushort)uVar3 & 0xff;
          auVar27._8_4_ = auVar20._0_4_;
          auVar27._12_4_ = auVar22._0_4_;
          auVar28 = pshuflw(auVar27,auVar27,0x1b);
          auVar28 = pshufhw(auVar28,auVar28,0x1b);
          sVar5 = auVar28._0_2_;
          sVar6 = auVar28._2_2_;
          sVar7 = auVar28._4_2_;
          sVar8 = auVar28._6_2_;
          sVar9 = auVar28._8_2_;
          sVar10 = auVar28._10_2_;
          sVar11 = auVar28._12_2_;
          sVar12 = auVar28._14_2_;
          *(ulong *)dst =
               CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar28[0xe] - (0xff < sVar12),
                        CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar28[0xc] - (0xff < sVar11),
                                 CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar28[10] -
                                          (0xff < sVar10),
                                          CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar28[8] -
                                                   (0xff < sVar9),
                                                   CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                            auVar28[6] - (0xff < sVar8),
                                                            CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                     auVar28[4] - (0xff < sVar7),
                                                                     CONCAT11((0 < sVar6) *
                                                                              (sVar6 < 0x100) *
                                                                              auVar28[2] -
                                                                              (0xff < sVar6),
                                                                              (0 < sVar5) *
                                                                              (sVar5 < 0x100) *
                                                                              auVar28[0] -
                                                                              (0xff < sVar5))))))));
          dst = (void *)((long)dst + 8);
        } while (dst < puVar1);
      }
    }
    else {
      if (0x1f < sizeof_element) {
        return false;
      }
      if (0 < lVar25) {
        do {
          sVar26 = 0;
          do {
            auStack_29[sVar26 + 1] = *(undefined1 *)((long)src + sVar26);
            sVar26 = sVar26 + 1;
          } while (sizeof_element != sVar26);
          src = (void *)((long)src + sVar26);
          sVar26 = sizeof_element;
          do {
            *(undefined1 *)dst = auStack_29[sVar26];
            dst = (void *)((long)dst + 1);
            sVar26 = sVar26 - 1;
          } while (sVar26 != 0);
        } while (dst < puVar1);
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ToggleByteOrder(
  size_t count,          // number of elements
  size_t sizeof_element, // size of element (2,4, or 8)
  const void* src,    // source buffer
  void* dst           // destination buffer (can be same as source buffer)
  )
{
  bool rc = (0 == count || (count > 0 && sizeof_element > 0 && nullptr != src && nullptr != dst));
  if ( rc && count > 0 ) 
  {
    unsigned char c[32];
    const unsigned char* a = (const unsigned char*)src;
    unsigned char* b = (unsigned char*)dst;
    const unsigned char* b1 = b + (count*sizeof_element);

    // loops are unrolled and a switch is used
    // to speed things up a bit.
    switch(sizeof_element) 
    {
    case 2:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 4:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 8:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        c[4] = *a++;
        c[5] = *a++;
        c[6] = *a++;
        c[7] = *a++;
        *b++ = c[7];
        *b++ = c[6];
        *b++ = c[5];
        *b++ = c[4];
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    default:
      if ( sizeof_element < 32 )
      {
        // As of 2 May 2003, this case is never used
        // by core opennurbs objects.
        //
        // This is here so that future code will work
        // if and when 128 bit "ints"/"doubles" become common
        // enough that they can be stored in 3dm files.
        // It may also happen that third party applications
        // on specialized CPUs need to toggle byte order
        // for 128 bit ints/doubles stored as user data.
        size_t i;
        while(b < b1)
        {
          for (i = 0; i < sizeof_element; i++)
            c[i] = *a++;
          while(i--)
            *b++ = c[i];
        }
      }
      else
      {
        rc = false;
      }
      break;
    }
  }
  return rc;
}